

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O0

Plausibility __thiscall
capnp::compiler::CompilerMain::isPlausiblyBinary
          (CompilerMain *this,ArrayPtr<const_unsigned_char> prefix)

{
  uchar uVar1;
  uchar uVar2;
  uchar uVar3;
  bool bVar4;
  uint segmentCount_00;
  size_t sVar5;
  uchar *puVar6;
  ulong start;
  ArrayPtr<const_unsigned_char> prefix_00;
  Fault local_70;
  Fault f;
  uint local_60;
  DebugExpression<unsigned_int> local_5c;
  undefined1 local_58 [8];
  DebugComparison<unsigned_int,_int> _kjCondition;
  uint32_t segment0Offset;
  uint32_t segment0Size;
  uint32_t segmentCount;
  CompilerMain *this_local;
  ArrayPtr<const_unsigned_char> prefix_local;
  
  prefix_local.ptr = (uchar *)prefix.size_;
  this_local = (CompilerMain *)prefix.ptr;
  sVar5 = kj::ArrayPtr<const_unsigned_char>::size((ArrayPtr<const_unsigned_char> *)&this_local);
  if (sVar5 < 8) {
    prefix_local.size_._4_4_ = PLAUSIBLE;
  }
  else {
    puVar6 = kj::ArrayPtr<const_unsigned_char>::operator[]
                       ((ArrayPtr<const_unsigned_char> *)&this_local,0);
    uVar1 = *puVar6;
    puVar6 = kj::ArrayPtr<const_unsigned_char>::operator[]
                       ((ArrayPtr<const_unsigned_char> *)&this_local,1);
    uVar2 = *puVar6;
    puVar6 = kj::ArrayPtr<const_unsigned_char>::operator[]
                       ((ArrayPtr<const_unsigned_char> *)&this_local,2);
    uVar3 = *puVar6;
    puVar6 = kj::ArrayPtr<const_unsigned_char>::operator[]
                       ((ArrayPtr<const_unsigned_char> *)&this_local,3);
    segmentCount_00 = CONCAT13(*puVar6,CONCAT12(uVar3,CONCAT11(uVar2,uVar1))) + 1;
    if (segmentCount_00 < 0x10001) {
      if (segmentCount_00 < 0x101) {
        puVar6 = kj::ArrayPtr<const_unsigned_char>::operator[]
                           ((ArrayPtr<const_unsigned_char> *)&this_local,4);
        uVar1 = *puVar6;
        puVar6 = kj::ArrayPtr<const_unsigned_char>::operator[]
                           ((ArrayPtr<const_unsigned_char> *)&this_local,5);
        uVar2 = *puVar6;
        puVar6 = kj::ArrayPtr<const_unsigned_char>::operator[]
                           ((ArrayPtr<const_unsigned_char> *)&this_local,6);
        uVar3 = *puVar6;
        puVar6 = kj::ArrayPtr<const_unsigned_char>::operator[]
                           ((ArrayPtr<const_unsigned_char> *)&this_local,7);
        if (CONCAT13(*puVar6,CONCAT12(uVar3,CONCAT11(uVar2,uVar1))) < 0x8000001) {
          _kjCondition._28_4_ = segmentCount_00 * 4 + 4;
          if ((_kjCondition._28_4_ & 7) != 0) {
            _kjCondition._28_4_ = segmentCount_00 * 4 + 8;
          }
          local_60 = _kjCondition._28_4_ & 7;
          local_5c = kj::_::DebugExpressionStart::operator<<
                               ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_60);
          f.exception._4_4_ = 0;
          kj::_::DebugExpression<unsigned_int>::operator==
                    ((DebugComparison<unsigned_int,_int> *)local_58,&local_5c,
                     (int *)((long)&f.exception + 4));
          bVar4 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_58);
          if (!bVar4) {
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,int>&>
                      (&local_70,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compiler/capnp.c++"
                       ,0x574,FAILED,"segment0Offset % 8 == 0","_kjCondition,",
                       (DebugComparison<unsigned_int,_int> *)local_58);
            kj::_::Debug::Fault::fatal(&local_70);
          }
          sVar5 = kj::ArrayPtr<const_unsigned_char>::size
                            ((ArrayPtr<const_unsigned_char> *)&this_local);
          if (sVar5 < _kjCondition._28_4_ + 8) {
            prefix_local.size_._4_4_ = PLAUSIBLE;
          }
          else {
            start = (ulong)(uint)_kjCondition._28_4_;
            sVar5 = kj::ArrayPtr<const_unsigned_char>::size
                              ((ArrayPtr<const_unsigned_char> *)&this_local);
            prefix_00 = kj::ArrayPtr<const_unsigned_char>::slice
                                  ((ArrayPtr<const_unsigned_char> *)&this_local,start,sVar5);
            prefix_local.size_._4_4_ = isPlausiblyFlat(this,prefix_00,segmentCount_00);
          }
        }
        else {
          prefix_local.size_._4_4_ = IMPLAUSIBLE;
        }
      }
      else {
        prefix_local.size_._4_4_ = IMPLAUSIBLE;
      }
    }
    else {
      prefix_local.size_._4_4_ = IMPOSSIBLE;
    }
  }
  return prefix_local.size_._4_4_;
}

Assistant:

Plausibility isPlausiblyBinary(kj::ArrayPtr<const byte> prefix) {
    if (prefix.size() < 8) {
      // Not enough prefix to say.
      return PLAUSIBLE;
    }

    uint32_t segmentCount = prefix[0] | (prefix[1] << 8)
                          | (prefix[2] << 16) | (prefix[3] << 24);

    // Actually, the bytes store segmentCount - 1.
    ++segmentCount;

    if (segmentCount > 65536) {
      // While technically possible, this is so implausible that we should mark it impossible.
      // This helps to make sure we fail fast on packed input.
      return IMPOSSIBLE;
    } else if (segmentCount > 256) {
      // Implausible segment count.
      return IMPLAUSIBLE;
    }

    uint32_t segment0Size = prefix[4] | (prefix[5] << 8)
                          | (prefix[6] << 16) | (prefix[7] << 24);

    if (segment0Size > (1 << 27)) {
      // Segment larger than 1G seems implausible.
      return IMPLAUSIBLE;
    }

    uint32_t segment0Offset = 4 + segmentCount * 4;
    if (segment0Offset % 8 != 0) {
      segment0Offset += 4;
    }
    KJ_ASSERT(segment0Offset % 8 == 0);

    if (prefix.size() < segment0Offset + 8) {
      // Segment 0 is past our prefix, so we can't check it.
      return PLAUSIBLE;
    }

    return isPlausiblyFlat(prefix.slice(segment0Offset, prefix.size()), segmentCount);
  }